

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.cpp
# Opt level: O1

void __thiscall
OpenMD::MolecularRestraint::calcForce
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *struc,
          Vector3d *molCom)

{
  pointer pVVar1;
  uint i;
  pointer pVVar2;
  long lVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  uint j;
  long lVar9;
  double *pdVar10;
  uint i_18;
  undefined1 *puVar11;
  double (*padVar12) [3];
  uint k;
  double ***pppdVar13;
  long lVar14;
  uint i_9;
  uint i_7;
  DynamicRectMatrix<double> *this_00;
  double tmp;
  double dVar15;
  double dVar16;
  double dVar17;
  Vector3d rLab;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result;
  DynamicVector<double,_std::allocator<double>_> stmp;
  DynamicRectMatrix<double> wtmp;
  DynamicRectMatrix<double> vtmp;
  DynamicRectMatrix<double> Rtmp;
  Vector3d fLab;
  Vector<double,_3U> result_1;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Vector3d fBody;
  Vector3d txr;
  Mat3x3d R;
  SVD<double> svd;
  RotMat3x3d Atrans;
  Quat4d quat;
  RotMat3x3d A;
  double local_338 [4];
  double local_318 [4];
  undefined1 local_2f8 [8];
  double adStack_2f0 [9];
  vector<double,_std::allocator<double>_> local_2a8;
  double local_288 [4];
  DynamicRectMatrix<double> local_268;
  DynamicRectMatrix<double> local_258;
  DynamicRectMatrix<double> local_248;
  double local_238 [4];
  double local_218 [10];
  double local_1c8;
  double local_1c0;
  double local_1b8 [4];
  double local_198 [4];
  double **local_178;
  double adStack_170 [9];
  SVD<double> local_128;
  double local_e8 [10];
  Quaternion<double> local_98;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (this->super_Restraint).pot_ = 0.0;
  pVVar1 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar2 = (this->forces_).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1) {
    (pVVar2->super_Vector<double,_3U>).data_[0] = 0.0;
    (pVVar2->super_Vector<double,_3U>).data_[1] = 0.0;
    (pVVar2->super_Vector<double,_3U>).data_[2] = 0.0;
  }
  if (((this->super_Restraint).restType_ & 1) != 0) {
    local_2f8 = (undefined1  [8])0x0;
    adStack_2f0[0] = 0.0;
    adStack_2f0[1] = 0.0;
    lVar3 = 0;
    do {
      *(double *)(local_2f8 + lVar3 * 8) =
           (molCom->super_Vector<double,_3U>).data_[lVar3] -
           (this->refCom_).super_Vector<double,_3U>.data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    adStack_170[1] = adStack_2f0[1];
    local_178 = (double **)local_2f8;
    adStack_170[0] = adStack_2f0[0];
    dVar15 = 0.0;
    lVar3 = 0;
    do {
      dVar15 = dVar15 + (double)(&local_178)[lVar3] * (double)(&local_178)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dVar16 = (this->super_Restraint).kDisp_ * 0.5 * dVar15 * dVar15;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar16;
    if ((this->super_Restraint).printRest_ == true) {
      local_2f8._0_4_ = 1;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_2f8);
      pmVar4->first = dVar15;
      pmVar4->second = dVar16;
    }
    pVVar1 = (this->forces_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pVVar2 = (this->forces_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1)
    {
      dVar15 = (this->super_Restraint).kDisp_;
      local_218[0] = 0.0;
      local_218[1] = 0.0;
      local_218[2] = 0.0;
      lVar3 = 0;
      do {
        local_218[lVar3] = (double)(&local_178)[lVar3] * -dVar15;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      dVar15 = (this->super_Restraint).scaleFactor_;
      local_2f8 = (undefined1  [8])0x0;
      adStack_2f0[0] = 0.0;
      adStack_2f0[1] = 0.0;
      lVar3 = 0;
      do {
        *(double *)(local_2f8 + lVar3 * 8) = local_218[lVar3] * dVar15;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        (pVVar2->super_Vector<double,_3U>).data_[lVar3] =
             *(double *)(local_2f8 + lVar3 * 8) + (pVVar2->super_Vector<double,_3U>).data_[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
    }
  }
  if (((this->super_Restraint).restType_ & 2) != 0) {
    dVar16 = (molCom->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar15 = (this->super_Restraint).kAbs_;
    dVar17 = dVar15 * 0.5 * dVar16 * dVar16;
    local_178 = (double **)0x0;
    adStack_170[0] = 0.0;
    adStack_170[1] = -dVar15 * dVar16;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar17;
    if ((this->super_Restraint).printRest_ == true) {
      local_2f8._0_4_ = 2;
      pmVar4 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_2f8);
      pmVar4->first = dVar16;
      pmVar4->second = dVar17;
    }
    pVVar1 = (this->forces_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pVVar2 = (this->forces_).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1)
    {
      dVar15 = (this->super_Restraint).scaleFactor_;
      local_2f8 = (undefined1  [8])0x0;
      adStack_2f0[0] = 0.0;
      adStack_2f0[1] = 0.0;
      lVar3 = 0;
      do {
        *(double *)(local_2f8 + lVar3 * 8) = (double)(&local_178)[lVar3] * dVar15;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar3 = 0;
      do {
        (pVVar2->super_Vector<double,_3U>).data_[lVar3] =
             *(double *)(local_2f8 + lVar3 * 8) + (pVVar2->super_Vector<double,_3U>).data_[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
    }
  }
  if (3 < (this->super_Restraint).restType_) {
    local_288[0] = 0.0;
    local_288[1] = 0.0;
    uVar5 = 0;
    local_288[2] = 0.0;
    adStack_170[7] = 0.0;
    adStack_170[5] = 0.0;
    adStack_170[6] = 0.0;
    adStack_170[3] = 0.0;
    adStack_170[4] = 0.0;
    adStack_170[1] = 0.0;
    adStack_170[2] = 0.0;
    local_178 = (double **)0x0;
    adStack_170[0] = 0.0;
    pVVar2 = (struc->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(struc->
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
    if (lVar3 != 0) {
      uVar8 = (lVar3 >> 3) * -0x5555555555555555;
      pVVar1 = (this->ref_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar3 = 0;
        do {
          pVVar2[uVar5].super_Vector<double,_3U>.data_[lVar3] =
               pVVar2[uVar5].super_Vector<double,_3U>.data_[lVar3] -
               (molCom->super_Vector<double,_3U>).data_[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        adStack_2f0[5] = 0.0;
        adStack_2f0[6] = 0.0;
        adStack_2f0[3] = 0.0;
        adStack_2f0[4] = 0.0;
        adStack_2f0[1] = 0.0;
        adStack_2f0[2] = 0.0;
        local_2f8 = (undefined1  [8])0x0;
        adStack_2f0[0] = 0.0;
        adStack_2f0[7] = 0.0;
        lVar3 = 0;
        puVar11 = local_2f8;
        do {
          dVar15 = pVVar2[uVar5].super_Vector<double,_3U>.data_[lVar3];
          lVar9 = 0;
          do {
            *(double *)(puVar11 + lVar9 * 8) =
                 pVVar1[uVar5].super_Vector<double,_3U>.data_[lVar9] * dVar15;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar3 = lVar3 + 1;
          puVar11 = puVar11 + 0x18;
        } while (lVar3 != 3);
        lVar3 = 0;
        puVar11 = local_2f8;
        pppdVar13 = &local_178;
        do {
          lVar9 = 0;
          do {
            pppdVar13[lVar9] =
                 (double **)(*(double *)(puVar11 + lVar9 * 8) + (double)pppdVar13[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar3 = lVar3 + 1;
          pppdVar13 = pppdVar13 + 3;
          puVar11 = puVar11 + 0x18;
        } while (lVar3 != 3);
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 <= uVar8 && uVar8 - uVar5 != 0);
    }
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_248,3,3,0.0);
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_258,3,3);
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x18);
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 3;
    *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = 0.0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_268,3,3);
    lVar3 = 0;
    do {
      pdVar6 = *local_248.data_;
      pdVar6[2] = adStack_170[lVar3 + 1];
      dVar15 = adStack_170[lVar3];
      *pdVar6 = (double)(&local_178)[lVar3];
      pdVar6[1] = dVar15;
      local_248.data_ = local_248.data_ + 1;
      lVar3 = lVar3 + 3;
    } while (lVar3 != 9);
    JAMA::SVD<double>::SVD(&local_128,&local_248);
    JAMA::SVD<double>::getU(&local_128,&local_258);
    std::vector<double,_std::allocator<double>_>::operator=(&local_2a8,&local_128.s.data_);
    DynamicRectMatrix<double>::operator=((DynamicRectMatrix<double> *)local_2f8,&local_268);
    this_00 = (DynamicRectMatrix<double> *)local_2f8;
    DynamicRectMatrix<double>::deallocate(this_00);
    lVar3 = 0;
    adStack_2f0[7] = 0.0;
    adStack_2f0[5] = 0.0;
    adStack_2f0[6] = 0.0;
    adStack_2f0[3] = 0.0;
    adStack_2f0[4] = 0.0;
    adStack_2f0[1] = 0.0;
    adStack_2f0[2] = 0.0;
    local_2f8 = (undefined1  [8])0x0;
    adStack_2f0[0] = 0.0;
    local_218[8] = 0.0;
    local_218[6] = 0.0;
    local_218[7] = 0.0;
    local_218[4] = 0.0;
    local_218[5] = 0.0;
    local_218[2] = 0.0;
    local_218[3] = 0.0;
    local_218[0] = 0.0;
    local_218[1] = 0.0;
    do {
      pdVar6 = *local_258.data_;
      adStack_2f0[lVar3 + 1] = pdVar6[2];
      dVar15 = pdVar6[1];
      *(double *)(local_2f8 + lVar3 * 8) = *pdVar6;
      adStack_2f0[lVar3] = dVar15;
      local_258.data_ = local_258.data_ + 1;
      lVar3 = lVar3 + 3;
    } while (lVar3 != 9);
    lVar3 = 0;
    do {
      pdVar6 = *local_268.data_;
      local_218[lVar3 + 2] = pdVar6[2];
      dVar15 = pdVar6[1];
      local_218[lVar3] = *pdVar6;
      local_218[lVar3 + 1] = dVar15;
      local_268.data_ = local_268.data_ + 1;
      lVar3 = lVar3 + 3;
    } while (lVar3 != 9);
    if ((local_218[2] * (local_218[3] * local_218[7] - local_218[6] * local_218[4]) +
        local_218[1] * (local_218[5] * local_218[6] - local_218[8] * local_218[3]) +
        local_218[0] * (local_218[4] * local_218[8] - local_218[7] * local_218[5])) *
        (adStack_2f0[1] * (adStack_2f0[2] * adStack_2f0[6] - adStack_2f0[5] * adStack_2f0[3]) +
        adStack_2f0[0] * (adStack_2f0[4] * adStack_2f0[5] - adStack_2f0[7] * adStack_2f0[2]) +
        (double)local_2f8 * (adStack_2f0[3] * adStack_2f0[7] - adStack_2f0[6] * adStack_2f0[4])) <
        0.0) {
      adStack_2f0[5] = -adStack_2f0[5];
      adStack_2f0[6] = -adStack_2f0[6];
      adStack_2f0[7] = -adStack_2f0[7];
    }
    pdVar6 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_38 = 0;
    pdVar7 = local_218;
    lVar3 = 0;
    do {
      lVar9 = 0;
      pdVar10 = pdVar6;
      do {
        *pdVar10 = pdVar7[lVar9];
        lVar9 = lVar9 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar9 != 3);
      lVar3 = lVar3 + 1;
      pdVar6 = pdVar6 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar3 != 3);
    local_e8[6] = 0.0;
    local_e8[7] = 0.0;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[8] = 0.0;
    lVar3 = 0;
    do {
      lVar9 = 0;
      pdVar6 = &local_78;
      do {
        dVar15 = local_e8[lVar3 * 3 + lVar9];
        lVar14 = 0;
        pdVar7 = pdVar6;
        do {
          dVar15 = dVar15 + (double)(&this_00->data_)[lVar14] * *pdVar7;
          lVar14 = lVar14 + 1;
          pdVar7 = pdVar7 + 3;
        } while (lVar14 != 3);
        local_e8[lVar3 * 3 + lVar9] = dVar15;
        lVar9 = lVar9 + 1;
        pdVar6 = pdVar6 + 1;
      } while (lVar9 != 3);
      lVar3 = lVar3 + 1;
      this_00 = (DynamicRectMatrix<double> *)&this_00[1].nrow_;
    } while (lVar3 != 3);
    pdVar6 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_38 = 0;
    pdVar7 = local_e8;
    lVar3 = 0;
    do {
      lVar9 = 0;
      pdVar10 = pdVar6;
      do {
        *pdVar10 = pdVar7[lVar9];
        lVar9 = lVar9 + 1;
        pdVar10 = pdVar10 + 3;
      } while (lVar9 != 3);
      lVar3 = lVar3 + 1;
      pdVar6 = pdVar6 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar3 != 3);
    SquareMatrix3<double>::toQuaternion(&local_98,(SquareMatrix3<double> *)&local_78);
    Quaternion<double>::toTwistSwing(&local_98,&local_1c0,&local_1c8,local_218 + 9);
    if (((this->super_Restraint).restType_ & 4) != 0) {
      dVar16 = local_1c0 - (this->super_Restraint).twist0_;
      dVar15 = (this->super_Restraint).kTwist_;
      dVar17 = dVar15 * 0.5 * dVar16 * dVar16;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar17;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar3 = 0;
      do {
        *(double *)((long)local_338 + lVar3) =
             *(double *)((long)&OpenMD::V3Z + lVar3) * dVar15 * dVar16;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      lVar3 = 0;
      do {
        local_288[lVar3] = local_288[lVar3] - local_338[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,4);
        pmVar4 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar4->first = local_1c0;
        pmVar4->second = dVar17;
      }
    }
    if (((this->super_Restraint).restType_ & 8) != 0) {
      dVar16 = local_1c8 - (this->super_Restraint).swingX0_;
      dVar15 = (this->super_Restraint).kSwingX_;
      dVar17 = dVar15 * 0.5 * dVar16 * dVar16;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar17;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar3 = 0;
      do {
        *(double *)((long)local_338 + lVar3) =
             *(double *)((long)&OpenMD::V3X + lVar3) * dVar15 * dVar16;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      lVar3 = 0;
      do {
        local_288[lVar3] = local_288[lVar3] - local_338[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,8);
        pmVar4 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar4->first = local_1c8;
        pmVar4->second = dVar17;
      }
    }
    if (((this->super_Restraint).restType_ & 0x10) != 0) {
      dVar16 = local_218[9] - (this->super_Restraint).swingY0_;
      dVar15 = (this->super_Restraint).kSwingY_;
      dVar17 = (this->super_Restraint).kSwingX_ * 0.5 * dVar16 * dVar16;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar17;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar3 = 0;
      do {
        *(double *)((long)local_338 + lVar3) =
             *(double *)((long)&OpenMD::V3Y + lVar3) * dVar15 * dVar16;
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
      lVar3 = 0;
      do {
        local_288[lVar3] = local_288[lVar3] - local_338[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,0x10);
        pmVar4 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar4->first = local_218[9];
        pmVar4->second = dVar17;
      }
    }
    dVar15 = 0.0;
    lVar3 = 0;
    do {
      dVar15 = dVar15 + local_288[lVar3] * local_288[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_338[0] = 0.0;
    local_338[1] = 0.0;
    uVar5 = 0;
    local_338[2] = 0.0;
    local_198[2] = 0.0;
    local_198[0] = 0.0;
    local_198[1] = 0.0;
    local_1b8[2] = 0.0;
    local_1b8[0] = 0.0;
    local_1b8[1] = 0.0;
    local_238[2] = 0.0;
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    pVVar2 = (struc->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(struc->
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
    if (lVar3 != 0) {
      uVar8 = (lVar3 >> 3) * -0x5555555555555555;
      pVVar1 = (this->forces_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_338[2] = pVVar2[uVar5].super_Vector<double,_3U>.data_[2];
        local_338[0] = pVVar2[uVar5].super_Vector<double,_3U>.data_[0];
        local_338[1] = pVVar2[uVar5].super_Vector<double,_3U>.data_[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar3 = 0;
        padVar12 = (double (*) [3])&local_78;
        do {
          dVar16 = local_318[lVar3];
          lVar9 = 0;
          do {
            dVar16 = dVar16 + (((SquareMatrix<double,_3> *)*padVar12)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][lVar9] * local_338[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_318[lVar3] = dVar16;
          lVar3 = lVar3 + 1;
          padVar12 = padVar12 + 1;
        } while (lVar3 != 3);
        local_198[0] = local_318[2] * local_288[1] + local_318[1] * -local_288[2];
        local_198[1] = local_318[0] * local_288[2] + local_318[2] * -local_288[0];
        local_198[2] = local_318[0] * -local_288[1] + local_288[0] * local_318[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar3 = 0;
        do {
          local_318[lVar3] = local_198[lVar3] * dVar15;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        local_1b8[2] = local_318[2];
        local_1b8[0] = local_318[0];
        local_1b8[1] = local_318[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar3 = 0;
        pdVar6 = local_e8;
        do {
          dVar16 = local_318[lVar3];
          lVar9 = 0;
          do {
            dVar16 = dVar16 + pdVar6[lVar9] * local_1b8[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_318[lVar3] = dVar16;
          lVar3 = lVar3 + 1;
          pdVar6 = pdVar6 + 3;
        } while (lVar3 != 3);
        local_238[2] = local_318[2];
        local_238[0] = local_318[0];
        local_238[1] = local_318[1];
        dVar16 = (this->super_Restraint).scaleFactor_;
        lVar3 = 0;
        do {
          local_238[lVar3] = local_238[lVar3] * dVar16;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        lVar3 = 0;
        do {
          pVVar1[uVar5].super_Vector<double,_3U>.data_[lVar3] =
               local_238[lVar3] + pVVar1[uVar5].super_Vector<double,_3U>.data_[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (uVar5 <= uVar8 && uVar8 - uVar5 != 0);
    }
    if (local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    DynamicRectMatrix<double>::deallocate(&local_128.V);
    DynamicRectMatrix<double>::deallocate(&local_128.U);
    DynamicRectMatrix<double>::deallocate(&local_268);
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    DynamicRectMatrix<double>::deallocate(&local_258);
    DynamicRectMatrix<double>::deallocate(&local_248);
  }
  return;
}

Assistant:

void MolecularRestraint::calcForce(std::vector<Vector3d> struc,
                                     Vector3d molCom) {
    assert(struc.size() == ref_.size());

    std::vector<Vector3d>::iterator it;

    // clear out initial values:
    pot_ = 0.0;
    for (it = forces_.begin(); it != forces_.end(); ++it)
      (*it) = 0.0;

    if (restType_ & rtDisplacement) {
      Vector3d del = molCom - refCom_;

      RealType r = del.length();
      RealType p = 0.5 * kDisp_ * r * r;

      pot_ += p;

      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += -kDisp_ * del * scaleFactor_;
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = molCom(2) - posZ0_;
      RealType p   = 0.5 * kAbs_ * r * r;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);

      pot_ += p;

      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += frc * scaleFactor_;
    }

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      Mat3x3d R(0.0);

      for (unsigned int n = 0; n < struc.size(); n++) {
        /*
         * First migrate the center of mass:
         */
        struc[n] -= molCom;

        /*
         * correlation matrix R:
         *   R(i,j) = sum(over n): y(n,i) * x(n,j)
         *   where x(n) and y(n) are two vector sets
         */

        R += outProduct(struc[n], ref_[n]);
      }

      // SVD class uses dynamic matrices, so we must wrap the correlation
      // matrix before calling SVD and then unwrap the results into Mat3x3d
      // and Vector3d before we use them.

      DynamicRectMatrix<RealType> Rtmp(3, 3, 0.0);
      DynamicRectMatrix<RealType> vtmp(3, 3);
      DynamicVector<RealType> stmp(3);
      DynamicRectMatrix<RealType> wtmp(3, 3);

      Rtmp.setSubMatrix(0, 0, R);

      // Heavy lifting goes here:

      JAMA::SVD<RealType> svd(Rtmp);

      svd.getU(vtmp);
      svd.getSingularValues(stmp);
      svd.getV(wtmp);

      Mat3x3d v;
      Vector3d s;
      Mat3x3d w_tr;

      vtmp.getSubMatrix(0, 0, v);
      stmp.getSubVector(0, s);
      wtmp.getSubMatrix(0, 0, w_tr);

      bool is_reflection = (v.determinant() * w_tr.determinant()) < 0.0;

      if (is_reflection) {
        v(2, 0) = -v(2, 0);
        v(2, 1) = -v(2, 1);
        v(2, 2) = -v(2, 2);
      }

      RotMat3x3d Atrans = v * w_tr.transpose();
      RotMat3x3d A      = Atrans.transpose();

      Quat4d quat = A.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType dVdtwist, dVdswingX, dVdswingY;
      RealType dTwist, dSwingX, dSwingY;
      RealType p;

      if (restType_ & rtTwist) {
        dTwist = twistAngle - twist0_;
        /// dVdtwist = kTwist_ * sin(dTwist) ;
        /// p = kTwist_ * (1.0 - cos(dTwist) ) ;
        dVdtwist = kTwist_ * dTwist;
        p        = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;
        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        dSwingX = swingX - swingX0_;
        /// dVdswingX = kSwingX_ * 2.0 * sin(2.0 * dSwingX);
        /// p = kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        dVdswingX = kSwingX_ * dSwingX;
        p         = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }
      if (restType_ & rtSwingY) {
        dSwingY = swingY - swingY0_;
        /// dVdswingY = kSwingY_ * 2.0 * sin(2.0 * dSwingY);
        /// p = kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        dVdswingY = kSwingY_ * dSwingY;
        p         = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      RealType t2 = dot(tBody, tBody);

      Vector3d rLab, rBody, txr, fBody, fLab;

      for (unsigned int i = 0; i < struc.size(); i++) {
        rLab  = struc[i];
        rBody = A * rLab;

        txr   = cross(tBody, rBody);
        fBody = txr * t2;
        fLab  = Atrans * fBody;
        fLab *= scaleFactor_;

        forces_[i] += fLab;
      }

      // test the force vectors and see if it is the right orientation
      //       std::cout << struc.size() << std::endl << std::endl;
      //       for (int i = 0; i != struc.size(); ++i){
      //         std::cout << "H\t" << struc[i].x() << "\t" << struc[i].y() <<
      //         "\t" << struc[i].z() << "\t"; std::cout << forces_[i].x() <<
      //         "\t"
      //         << forces_[i].y()
      //         << "\t" << forces_[i].z() << std::endl;
      //       }
    }
  }